

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

cmFileLockResult __thiscall
cmFileLockPool::LockFileScope(cmFileLockPool *this,string *filename,unsigned_long timeoutSec)

{
  bool bVar1;
  cmFileLockResult cVar2;
  
  bVar1 = IsAlreadyLocked(this,filename);
  if (bVar1) {
    cVar2 = cmFileLockResult::MakeAlreadyLocked();
    return cVar2;
  }
  if ((this->FileScopes).
      super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>.
      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->FileScopes) {
    cVar2 = ScopePool::Lock((ScopePool *)
                            (this->FileScopes).
                            super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                            ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next,filename,
                            timeoutSec);
    return cVar2;
  }
  __assert_fail("!this->FileScopes.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmFileLockPool.cxx"
                ,0x4c,
                "cmFileLockResult cmFileLockPool::LockFileScope(const std::string &, unsigned long)"
               );
}

Assistant:

cmFileLockResult cmFileLockPool::LockFileScope(
    const std::string& filename, unsigned long timeoutSec)
{
  if (this->IsAlreadyLocked(filename))
    {
    return cmFileLockResult::MakeAlreadyLocked();
    }
  assert(!this->FileScopes.empty());
  return this->FileScopes.back()->Lock(filename, timeoutSec);
}